

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

void slang::ast::findIfaces
               (ClassType *type,SmallVectorBase<const_slang::ast::Type_*> *ifaces,
               SmallSet<const_slang::ast::Symbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
               *visited)

{
  undefined1 *this;
  char *pcVar1;
  pointer ppTVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  pointer ppTVar8;
  Type *this_00;
  ClassType *type_00;
  value_type *elements;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  byte bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  span<const_slang::ast::Type_*const,_18446744073709551615UL> sVar21;
  Type *iface;
  ClassType *local_90;
  undefined8 local_88;
  table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
  *local_80;
  ClassType *local_78;
  locator local_70;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  byte bStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  byte bStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  byte bStack_39;
  
  if (type->isInterface == true) {
    this = &(visited->super_Storage).field_0x28;
    local_88 = *(undefined8 *)&(visited->super_Storage).field_0x28;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = type;
    uVar11 = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar9 = uVar11 >> (visited->field_0x30 & 0x3f);
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar11 & 0xff];
    uVar12 = 0;
    uVar14 = uVar9;
    do {
      pcVar1 = (char *)(*(long *)&visited->field_0x40 + uVar14 * 0x10);
      local_48 = *pcVar1;
      cStack_47 = pcVar1[1];
      cStack_46 = pcVar1[2];
      bStack_45 = pcVar1[3];
      cStack_44 = pcVar1[4];
      cStack_43 = pcVar1[5];
      cStack_42 = pcVar1[6];
      bStack_41 = pcVar1[7];
      cStack_40 = pcVar1[8];
      cStack_3f = pcVar1[9];
      cStack_3e = pcVar1[10];
      bStack_3d = pcVar1[0xb];
      cStack_3c = pcVar1[0xc];
      cStack_3b = pcVar1[0xd];
      cStack_3a = pcVar1[0xe];
      bStack_39 = pcVar1[0xf];
      cVar15 = (char)uVar3;
      auVar19[0] = -(local_48 == cVar15);
      cVar16 = (char)((uint)uVar3 >> 8);
      auVar19[1] = -(cStack_47 == cVar16);
      cVar17 = (char)((uint)uVar3 >> 0x10);
      auVar19[2] = -(cStack_46 == cVar17);
      bVar18 = (byte)((uint)uVar3 >> 0x18);
      auVar19[3] = -(bStack_45 == bVar18);
      auVar19[4] = -(cStack_44 == cVar15);
      auVar19[5] = -(cStack_43 == cVar16);
      auVar19[6] = -(cStack_42 == cVar17);
      auVar19[7] = -(bStack_41 == bVar18);
      auVar19[8] = -(cStack_40 == cVar15);
      auVar19[9] = -(cStack_3f == cVar16);
      auVar19[10] = -(cStack_3e == cVar17);
      auVar19[0xb] = -(bStack_3d == bVar18);
      auVar19[0xc] = -(cStack_3c == cVar15);
      auVar19[0xd] = -(cStack_3b == cVar16);
      auVar19[0xe] = -(cStack_3a == cVar17);
      auVar19[0xf] = -(bStack_39 == bVar18);
      uVar10 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
      local_90 = type;
      if (uVar10 != 0) {
        do {
          uVar4 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
            }
          }
          if (*(ClassType **)(*(long *)&visited->field_0x48 + uVar14 * 0x78 + (ulong)uVar4 * 8) ==
              type) goto LAB_0028b163;
          uVar10 = uVar10 - 1 & uVar10;
        } while (uVar10 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar11 & 7] & bStack_39) == 0) break;
      lVar13 = uVar14 + uVar12;
      uVar12 = uVar12 + 1;
      uVar14 = lVar13 + 1U & *(ulong *)&visited->field_0x38;
    } while (uVar12 <= *(ulong *)&visited->field_0x38);
    if (*(ulong *)&visited->field_0x58 < *(ulong *)&visited->field_0x50) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
      ::unchecked_emplace_at<slang::ast::Symbol_const*>
                (&local_70,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
                  *)this,uVar9,uVar11,(Symbol **)&local_90);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
      ::unchecked_emplace_with_rehash<slang::ast::Symbol_const*>
                (&local_70,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
                  *)this,uVar11,(Symbol **)&local_90);
    }
    local_70.pg = (group15<boost::unordered::detail::foa::plain_integral> *)type;
    SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
              ((SmallVectorBase<slang::ast::Type_const*> *)ifaces,(Type **)&local_70);
  }
LAB_0028b163:
  sVar21 = ClassType::getImplementedInterfaces(type);
  ppTVar8 = sVar21._M_ptr;
  ppTVar2 = ppTVar8 + sVar21._M_extent._M_extent_value._M_extent_value;
  local_80 = (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
              *)&(visited->super_Storage).field_0x28;
  do {
    if (ppTVar8 == ppTVar2) {
      this_00 = ClassType::getBaseClass(type);
      if ((this_00 != (Type *)0x0) && (bVar7 = Type::isError(this_00), !bVar7)) {
        type_00 = (ClassType *)Type::getCanonicalType(this_00);
        findIfaces(type_00,ifaces,visited);
      }
      return;
    }
    local_90 = (ClassType *)*ppTVar8;
    local_88 = *(undefined8 *)&(visited->super_Storage).field_0x28;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_90;
    uVar11 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar9 = uVar11 >> (visited->field_0x30 & 0x3f);
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar11 & 0xff];
    uVar12 = 0;
    uVar14 = uVar9;
    do {
      pcVar1 = (char *)(*(long *)&visited->field_0x40 + uVar14 * 0x10);
      local_58 = *pcVar1;
      cStack_57 = pcVar1[1];
      cStack_56 = pcVar1[2];
      bStack_55 = pcVar1[3];
      cStack_54 = pcVar1[4];
      cStack_53 = pcVar1[5];
      cStack_52 = pcVar1[6];
      bStack_51 = pcVar1[7];
      cStack_50 = pcVar1[8];
      cStack_4f = pcVar1[9];
      cStack_4e = pcVar1[10];
      bStack_4d = pcVar1[0xb];
      cStack_4c = pcVar1[0xc];
      cStack_4b = pcVar1[0xd];
      cStack_4a = pcVar1[0xe];
      bStack_49 = pcVar1[0xf];
      cVar15 = (char)uVar3;
      auVar20[0] = -(local_58 == cVar15);
      cVar16 = (char)((uint)uVar3 >> 8);
      auVar20[1] = -(cStack_57 == cVar16);
      cVar17 = (char)((uint)uVar3 >> 0x10);
      auVar20[2] = -(cStack_56 == cVar17);
      bVar18 = (byte)((uint)uVar3 >> 0x18);
      auVar20[3] = -(bStack_55 == bVar18);
      auVar20[4] = -(cStack_54 == cVar15);
      auVar20[5] = -(cStack_53 == cVar16);
      auVar20[6] = -(cStack_52 == cVar17);
      auVar20[7] = -(bStack_51 == bVar18);
      auVar20[8] = -(cStack_50 == cVar15);
      auVar20[9] = -(cStack_4f == cVar16);
      auVar20[10] = -(cStack_4e == cVar17);
      auVar20[0xb] = -(bStack_4d == bVar18);
      auVar20[0xc] = -(cStack_4c == cVar15);
      auVar20[0xd] = -(cStack_4b == cVar16);
      auVar20[0xe] = -(cStack_4a == cVar17);
      auVar20[0xf] = -(bStack_49 == bVar18);
      uVar10 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
      local_78 = local_90;
      if (uVar10 != 0) {
        do {
          uVar4 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
            }
          }
          if (local_90 ==
              *(ClassType **)(*(long *)&visited->field_0x48 + uVar14 * 0x78 + (ulong)uVar4 * 8))
          goto LAB_0028b28d;
          uVar10 = uVar10 - 1 & uVar10;
        } while (uVar10 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar11 & 7] & bStack_49) == 0) break;
      lVar13 = uVar14 + uVar12;
      uVar12 = uVar12 + 1;
      uVar14 = lVar13 + 1U & *(ulong *)&visited->field_0x38;
    } while (uVar12 <= *(ulong *)&visited->field_0x38);
    if (*(ulong *)&visited->field_0x58 < *(ulong *)&visited->field_0x50) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
      ::unchecked_emplace_at<slang::ast::Symbol_const*>
                (&local_70,local_80,uVar9,uVar11,(Symbol **)&local_90);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
      ::unchecked_emplace_with_rehash<slang::ast::Symbol_const*>
                (&local_70,local_80,uVar11,(Symbol **)&local_90);
    }
    SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*const&>
              ((SmallVectorBase<slang::ast::Type_const*> *)ifaces,(Type **)&local_78);
LAB_0028b28d:
    ppTVar8 = ppTVar8 + 1;
  } while( true );
}

Assistant:

static void findIfaces(const ClassType& type, SmallVectorBase<const Type*>& ifaces,
                       SmallSet<const Symbol*, 4>& visited) {
    if (type.isInterface) {
        if (visited.emplace(&type).second)
            ifaces.push_back(&type);
    }

    for (auto iface : type.getImplementedInterfaces()) {
        if (visited.emplace(iface).second)
            ifaces.push_back(iface);
    }

    if (auto base = type.getBaseClass(); base && !base->isError())
        findIfaces(base->getCanonicalType().as<ClassType>(), ifaces, visited);
}